

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O3

int LoadBuildInfo(TCascStorage *hs)

{
  CBLD_TYPE CVar1;
  int iVar2;
  void *pvListFile;
  code *pcVar3;
  code *pcVar4;
  
  CVar1 = hs->BuildFileType;
  pvListFile = ListFile_OpenExternal(hs->szBuildFile);
  if (pvListFile == (void *)0x0) {
    iVar2 = 2;
  }
  else {
    pcVar3 = (code *)0x0;
    if (CVar1 == CascBuildDb) {
      pcVar3 = ParseFile_BuildDb;
    }
    pcVar4 = ParseFile_BuildInfo;
    if (CVar1 != CascBuildInfo) {
      pcVar4 = pcVar3;
    }
    iVar2 = (*pcVar4)(hs,pvListFile);
    ListFile_Free(pvListFile);
  }
  return iVar2;
}

Assistant:

int LoadBuildInfo(TCascStorage * hs)
{
    PARSEINFOFILE PfnParseProc = NULL;
    int nError = ERROR_NOT_SUPPORTED;

    // We support either ".build.info" or ".build.db"
    switch (hs->BuildFileType)
    {
        case CascBuildInfo:
            PfnParseProc = ParseFile_BuildInfo;
            break;

        case CascBuildDb:
            PfnParseProc = ParseFile_BuildDb;
            break;

        default:
            nError = ERROR_NOT_SUPPORTED;
            break;
    }

    return LoadTextFile(hs, PfnParseProc);
}